

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

FILE * fopen_or_fail(string *file_name,char *mode)

{
  FILE *pFVar1;
  
  pFVar1 = fopen((file_name->_M_dataplus)._M_p,mode);
  if (pFVar1 != (FILE *)0x0) {
    return (FILE *)pFVar1;
  }
  quit("opening output file %s failed",(file_name->_M_dataplus)._M_p);
}

Assistant:

FILE* fopen_or_fail(std::string file_name, const char* mode)
{
    FILE* out_file = fopen(file_name.c_str(), mode);
    if (!out_file) {
        quit("opening output file %s failed", file_name.c_str());
    }
    return out_file;
}